

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

bool __thiscall QFSFileEngine::rename_helper(QFSFileEngine *this,QString *newName,RenameMode mode)

{
  byte bVar1;
  QFSFileEnginePrivate *pQVar2;
  int in_EDX;
  QAbstractFileEngine *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  bool ret;
  _func_bool_QFileSystemEntry_ptr_QFileSystemEntry_ptr_QSystemError_ptr *func;
  QFSFileEnginePrivate *d;
  QSystemError error;
  QFileSystemEntry newEntry;
  QFileSystemEntry *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  code *pcVar4;
  code *pcVar5;
  FileError error_00;
  QSystemError local_48;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QFSFileEngine *)0x12c929);
  if (in_EDX == 0) {
    pcVar4 = QFileSystemEngine::renameFile;
  }
  else {
    pcVar4 = QFileSystemEngine::renameOverwriteFile;
  }
  local_48.errorCode = -0x55555556;
  local_48.errorScope = 0xaaaaaaaa;
  pcVar5 = pcVar4;
  QSystemError::QSystemError(&local_48);
  error_00 = (FileError)((ulong)pcVar5 >> 0x20);
  memset(local_40,0xaa,0x38);
  QFileSystemEntry::QFileSystemEntry
            ((QFileSystemEntry *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             &in_stack_ffffffffffffff48->m_filePath);
  bVar1 = (*pcVar4)(&pQVar2->fileEntry,local_40,&local_48);
  bVar3 = (bVar1 & 1) != 0;
  if (bVar3) {
    setFileEntry((QFSFileEngine *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
  }
  else {
    QSystemError::toString((QSystemError *)in_stack_ffffffffffffff48);
    QAbstractFileEngine::setError
              (in_RDI,error_00,
               (QString *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    QString::~QString((QString *)0x12c9e8);
  }
  QFileSystemEntry::~QFileSystemEntry
            ((QFileSystemEntry *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::rename_helper(const QString &newName, RenameMode mode)
{
    Q_D(QFSFileEngine);

    auto func = mode == Rename ? QFileSystemEngine::renameFile
                               : QFileSystemEngine::renameOverwriteFile;
    QSystemError error;
    auto newEntry = QFileSystemEntry(newName);
    const bool ret = func(d->fileEntry, newEntry, error);
    if (!ret) {
        setError(QFile::RenameError, error.toString());
        return false;
    }
    setFileEntry(std::move(newEntry));
    return true;
}